

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_add_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  bcf_hrec_t *pbVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  bcf_hrec_t **ppbVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = 0;
  if (hrec != (bcf_hrec_t *)0x0) {
    hrec->type = 5;
    iVar2 = bcf_hdr_register_hrec(hdr,hrec);
    if (iVar2 == 0) {
      if (hrec->type != 5) {
        bcf_hrec_destroy(hrec);
        return 0;
      }
      iVar2 = hdr->nhrec;
      if (0 < (long)iVar2) {
        ppbVar4 = hdr->hrec;
        lVar6 = 0;
        do {
          pbVar1 = ppbVar4[lVar6];
          if (pbVar1->type == 5) {
            __s2 = hrec->key;
            iVar3 = strcmp(pbVar1->key,__s2);
            if ((iVar3 == 0) &&
               ((iVar3 = strcmp(__s2,"fileformat"), iVar3 == 0 ||
                (iVar3 = strcmp(pbVar1->value,hrec->value), iVar3 == 0)))) {
              bcf_hrec_destroy(hrec);
              return 0;
            }
          }
          lVar6 = lVar6 + 1;
        } while (iVar2 != lVar6);
      }
    }
    else {
      iVar2 = hdr->nhrec;
    }
    hdr->nhrec = iVar2 + 1;
    ppbVar4 = (bcf_hrec_t **)realloc(hdr->hrec,(long)iVar2 * 8 + 8);
    hdr->hrec = ppbVar4;
    ppbVar4[iVar2] = hrec;
    hdr->dirty = 1;
    uVar5 = (uint)(hrec->type != 5);
  }
  return uVar5;
}

Assistant:

int bcf_hdr_add_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    if ( !hrec ) return 0;

    hrec->type = BCF_HL_GEN;
    if ( !bcf_hdr_register_hrec(hdr,hrec) )
    {
        // If one of the hashed field, then it is already present
        if ( hrec->type != BCF_HL_GEN )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }

        // Is one of the generic fields and already present?
        int i;
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=BCF_HL_GEN ) continue;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hrec->key,"fileformat") ) break;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hdr->hrec[i]->value,hrec->value) ) break;
        }
        if ( i<hdr->nhrec )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }
    }

    // New record, needs to be added
    int n = ++hdr->nhrec;
    hdr->hrec = (bcf_hrec_t**) realloc(hdr->hrec, n*sizeof(bcf_hrec_t*));
    hdr->hrec[n-1] = hrec;
    hdr->dirty = 1;

    return hrec->type==BCF_HL_GEN ? 0 : 1;
}